

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::DoubleAPFloat::addImpl
          (DoubleAPFloat *this,APFloat *a,APFloat *aa,APFloat *c,APFloat *cc,roundingMode RM)

{
  bool bVar1;
  opStatus oVar2;
  cmpResult cVar3;
  type pAVar4;
  type RHS;
  undefined1 local_c8 [8];
  APFloat zz_1;
  APFloat q;
  APFloat zz;
  cmpResult AComparedToC;
  APFloat z;
  int Status;
  roundingMode RM_local;
  APFloat *cc_local;
  APFloat *c_local;
  APFloat *aa_local;
  APFloat *a_local;
  DoubleAPFloat *this_local;
  
  z.U._16_4_ = 0;
  z.U._20_4_ = RM;
  APFloat::APFloat((APFloat *)&AComparedToC,a);
  oVar2 = APFloat::add((APFloat *)&AComparedToC,c,z.U._20_4_);
  z.U._16_4_ = oVar2 | z.U._16_4_;
  bVar1 = APFloat::isFinite((APFloat *)&AComparedToC);
  if (bVar1) {
    APFloat::APFloat((APFloat *)((long)&zz_1.U + 0x10),a);
    oVar2 = APFloat::subtract((APFloat *)((long)&zz_1.U + 0x10),(APFloat *)&AComparedToC,z.U._20_4_)
    ;
    z.U._16_4_ = oVar2 | z.U._16_4_;
    APFloat::APFloat((APFloat *)local_c8,(APFloat *)((long)&zz_1.U + 0x10));
    oVar2 = APFloat::add((APFloat *)local_c8,c,z.U._20_4_);
    z.U._16_4_ = oVar2 | z.U._16_4_;
    oVar2 = APFloat::add((APFloat *)((long)&zz_1.U + 0x10),(APFloat *)&AComparedToC,z.U._20_4_);
    z.U._16_4_ = oVar2 | z.U._16_4_;
    oVar2 = APFloat::subtract((APFloat *)((long)&zz_1.U + 0x10),a,z.U._20_4_);
    z.U._16_4_ = oVar2 | z.U._16_4_;
    APFloat::changeSign((APFloat *)((long)&zz_1.U + 0x10));
    oVar2 = APFloat::add((APFloat *)local_c8,(APFloat *)((long)&zz_1.U + 0x10),z.U._20_4_);
    z.U._16_4_ = oVar2 | z.U._16_4_;
    oVar2 = APFloat::add((APFloat *)local_c8,aa,z.U._20_4_);
    z.U._16_4_ = oVar2 | z.U._16_4_;
    oVar2 = APFloat::add((APFloat *)local_c8,cc,z.U._20_4_);
    z.U._16_4_ = oVar2 | z.U._16_4_;
    bVar1 = APFloat::isZero((APFloat *)local_c8);
    if ((!bVar1) || (bVar1 = APFloat::isNegative((APFloat *)local_c8), bVar1)) {
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,0);
      APFloat::operator=(pAVar4,(APFloat *)&AComparedToC);
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,0);
      oVar2 = APFloat::add(pAVar4,(APFloat *)local_c8,z.U._20_4_);
      z.U._16_4_ = oVar2 | z.U._16_4_;
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,0);
      bVar1 = APFloat::isFinite(pAVar4);
      if (bVar1) {
        pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                           (&this->Floats,1);
        APFloat::operator=(pAVar4,(APFloat *)&AComparedToC);
        pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                           (&this->Floats,1);
        RHS = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                        (&this->Floats,0);
        oVar2 = APFloat::subtract(pAVar4,RHS,z.U._20_4_);
        z.U._16_4_ = oVar2 | z.U._16_4_;
        pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                           (&this->Floats,1);
        oVar2 = APFloat::add(pAVar4,(APFloat *)local_c8,z.U._20_4_);
        z.U._16_4_ = oVar2 | z.U._16_4_;
        bVar1 = false;
      }
      else {
        pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                           (&this->Floats,1);
        APFloat::makeZero(pAVar4,false);
        this_local._4_4_ = z.U._16_4_;
        bVar1 = true;
      }
    }
    else {
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,0);
      APFloat::operator=(pAVar4,(APFloat *)&AComparedToC);
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      APFloat::makeZero(pAVar4,false);
      this_local._4_4_ = opOK;
      bVar1 = true;
    }
    APFloat::~APFloat((APFloat *)local_c8);
    APFloat::~APFloat((APFloat *)((long)&zz_1.U + 0x10));
    if (bVar1) goto LAB_0023d418;
  }
  else {
    bVar1 = APFloat::isInfinity((APFloat *)&AComparedToC);
    if (!bVar1) {
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,0);
      APFloat::operator=(pAVar4,(APFloat *)&AComparedToC);
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      APFloat::makeZero(pAVar4,false);
      this_local._4_4_ = z.U._16_4_;
      goto LAB_0023d418;
    }
    z.U._16_4_ = 0;
    cVar3 = APFloat::compareAbsoluteValue(a,c);
    APFloat::operator=((APFloat *)&AComparedToC,cc);
    oVar2 = APFloat::add((APFloat *)&AComparedToC,aa,z.U._20_4_);
    z.U._16_4_ = oVar2 | z.U._16_4_;
    if (cVar3 == cmpGreaterThan) {
      oVar2 = APFloat::add((APFloat *)&AComparedToC,c,z.U._20_4_);
      z.U._16_4_ = oVar2 | z.U._16_4_;
      oVar2 = APFloat::add((APFloat *)&AComparedToC,a,z.U._20_4_);
      z.U._16_4_ = oVar2 | z.U._16_4_;
    }
    else {
      oVar2 = APFloat::add((APFloat *)&AComparedToC,a,z.U._20_4_);
      z.U._16_4_ = oVar2 | z.U._16_4_;
      oVar2 = APFloat::add((APFloat *)&AComparedToC,c,z.U._20_4_);
      z.U._16_4_ = oVar2 | z.U._16_4_;
    }
    bVar1 = APFloat::isFinite((APFloat *)&AComparedToC);
    if (!bVar1) {
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,0);
      APFloat::operator=(pAVar4,(APFloat *)&AComparedToC);
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      APFloat::makeZero(pAVar4,false);
      this_local._4_4_ = z.U._16_4_;
      goto LAB_0023d418;
    }
    pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&this->Floats,0);
    APFloat::operator=(pAVar4,(APFloat *)&AComparedToC);
    APFloat::APFloat((APFloat *)((long)&q.U + 0x10),aa);
    oVar2 = APFloat::add((APFloat *)((long)&q.U + 0x10),cc,z.U._20_4_);
    z.U._16_4_ = oVar2 | z.U._16_4_;
    if (cVar3 == cmpGreaterThan) {
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      APFloat::operator=(pAVar4,a);
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      oVar2 = APFloat::subtract(pAVar4,(APFloat *)&AComparedToC,z.U._20_4_);
      z.U._16_4_ = oVar2 | z.U._16_4_;
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      oVar2 = APFloat::add(pAVar4,c,z.U._20_4_);
      z.U._16_4_ = oVar2 | z.U._16_4_;
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      oVar2 = APFloat::add(pAVar4,(APFloat *)((long)&q.U + 0x10),z.U._20_4_);
      z.U._16_4_ = oVar2 | z.U._16_4_;
    }
    else {
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      APFloat::operator=(pAVar4,c);
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      oVar2 = APFloat::subtract(pAVar4,(APFloat *)&AComparedToC,z.U._20_4_);
      z.U._16_4_ = oVar2 | z.U._16_4_;
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      oVar2 = APFloat::add(pAVar4,a,z.U._20_4_);
      z.U._16_4_ = oVar2 | z.U._16_4_;
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      oVar2 = APFloat::add(pAVar4,(APFloat *)((long)&q.U + 0x10),z.U._20_4_);
      z.U._16_4_ = oVar2 | z.U._16_4_;
    }
    APFloat::~APFloat((APFloat *)((long)&q.U + 0x10));
  }
  this_local._4_4_ = z.U._16_4_;
LAB_0023d418:
  APFloat::~APFloat((APFloat *)&AComparedToC);
  return this_local._4_4_;
}

Assistant:

APFloat::opStatus DoubleAPFloat::addImpl(const APFloat &a, const APFloat &aa,
                                         const APFloat &c, const APFloat &cc,
                                         roundingMode RM) {
  int Status = opOK;
  APFloat z = a;
  Status |= z.add(c, RM);
  if (!z.isFinite()) {
    if (!z.isInfinity()) {
      Floats[0] = std::move(z);
      Floats[1].makeZero(/* Neg = */ false);
      return (opStatus)Status;
    }
    Status = opOK;
    auto AComparedToC = a.compareAbsoluteValue(c);
    z = cc;
    Status |= z.add(aa, RM);
    if (AComparedToC == APFloat::cmpGreaterThan) {
      // z = cc + aa + c + a;
      Status |= z.add(c, RM);
      Status |= z.add(a, RM);
    } else {
      // z = cc + aa + a + c;
      Status |= z.add(a, RM);
      Status |= z.add(c, RM);
    }
    if (!z.isFinite()) {
      Floats[0] = std::move(z);
      Floats[1].makeZero(/* Neg = */ false);
      return (opStatus)Status;
    }
    Floats[0] = z;
    APFloat zz = aa;
    Status |= zz.add(cc, RM);
    if (AComparedToC == APFloat::cmpGreaterThan) {
      // Floats[1] = a - z + c + zz;
      Floats[1] = a;
      Status |= Floats[1].subtract(z, RM);
      Status |= Floats[1].add(c, RM);
      Status |= Floats[1].add(zz, RM);
    } else {
      // Floats[1] = c - z + a + zz;
      Floats[1] = c;
      Status |= Floats[1].subtract(z, RM);
      Status |= Floats[1].add(a, RM);
      Status |= Floats[1].add(zz, RM);
    }
  } else {
    // q = a - z;
    APFloat q = a;
    Status |= q.subtract(z, RM);

    // zz = q + c + (a - (q + z)) + aa + cc;
    // Compute a - (q + z) as -((q + z) - a) to avoid temporary copies.
    auto zz = q;
    Status |= zz.add(c, RM);
    Status |= q.add(z, RM);
    Status |= q.subtract(a, RM);
    q.changeSign();
    Status |= zz.add(q, RM);
    Status |= zz.add(aa, RM);
    Status |= zz.add(cc, RM);
    if (zz.isZero() && !zz.isNegative()) {
      Floats[0] = std::move(z);
      Floats[1].makeZero(/* Neg = */ false);
      return opOK;
    }
    Floats[0] = z;
    Status |= Floats[0].add(zz, RM);
    if (!Floats[0].isFinite()) {
      Floats[1].makeZero(/* Neg = */ false);
      return (opStatus)Status;
    }
    Floats[1] = std::move(z);
    Status |= Floats[1].subtract(Floats[0], RM);
    Status |= Floats[1].add(zz, RM);
  }
  return (opStatus)Status;
}